

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

void __thiscall
slang::SmallVectorBase<slang::SmallVector<slang::SmallVector<int,_10UL>,_2UL>_>::cleanup
          (SmallVectorBase<slang::SmallVector<slang::SmallVector<int,_10UL>,_2UL>_> *this,
          EVP_PKEY_CTX *ctx)

{
  pointer this_00;
  long lVar1;
  
  if (this->len != 0) {
    this_00 = this->data_;
    lVar1 = this->len * 0x98;
    do {
      SmallVectorBase<slang::SmallVector<int,_10UL>_>::cleanup
                (&this_00->super_SmallVectorBase<slang::SmallVector<int,_10UL>_>,ctx);
      this_00 = this_00 + 1;
      lVar1 = lVar1 + -0x98;
    } while (lVar1 != 0);
  }
  if (this->data_ != (pointer)this->firstElement) {
    operator_delete(this->data_);
    return;
  }
  return;
}

Assistant:

void cleanup() {
        std::ranges::destroy(*this);
        if (!isSmall())
            ::operator delete(data_);
    }